

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlog.cpp
# Opt level: O3

void vm_log(char *str,size_t len)

{
  FILE *__stream;
  tm *__tp;
  char *pcVar1;
  size_t sVar2;
  time_t timer;
  CVmDataSource local_40;
  FILE *local_38;
  time_t local_30;
  
  __stream = (FILE *)osfoprwt(G_syslogfile_X,7);
  if (__stream != (FILE *)0x0) {
    local_40._vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_0034bc60;
    local_38 = __stream;
    local_30 = time((time_t *)0x0);
    __tp = localtime(&local_30);
    pcVar1 = asctime(__tp);
    sVar2 = strlen(pcVar1);
    if ((sVar2 != 0) && (pcVar1[sVar2 - 1] == '\n')) {
      pcVar1[sVar2 - 1] = '\0';
    }
    pcVar1 = t3sprintf_alloc("[%s] %.*s\n",pcVar1,len & 0xffffffff,str);
    sVar2 = strlen(pcVar1);
    fseek(__stream,0,2);
    if (G_cmap_to_log_X == (CCharmapToLocal *)0x0) {
      fwrite(pcVar1,sVar2,1,__stream);
      free(pcVar1);
    }
    else {
      CCharmapToLocal::write_file(G_cmap_to_file_X,&local_40,pcVar1,sVar2);
      __stream = local_38;
      free(pcVar1);
      if (__stream == (FILE *)0x0) {
        return;
      }
    }
    local_40._vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_0034bc60;
    fclose(__stream);
  }
  return;
}

Assistant:

void vm_log(VMG_ const char *str, size_t len)
{
    /* open the system log file */
    osfildef *fp = osfoprwt(G_syslogfile, OSFTTEXT);
    if (fp != 0)
    {
        /* wrap it in a data source */
        CVmFileSource ds(fp);

        /* get a printable timestamp */
        os_time_t timer = os_time(0);
        struct tm *tblk = os_localtime(&timer);
        char *tmsg = asctime(tblk);

        /* remove the trailing '\n' from the asctime message */
        size_t tmsgl = strlen(tmsg);
        if (tmsgl > 0 && tmsg[tmsgl-1] == '\n')
            tmsg[--tmsgl] = '\0';

        /* build the full message: [<timestamp>] <message> <newline> */
        char *msg = t3sprintf_alloc("[%s] %.*s\n", tmsg, (int)len, str);
        size_t msglen = strlen(msg);

        /* seek to the end of the file */
        ds.seek(0, OSFSK_END);

        /* if we can convert to a local character set, do so */
        if (G_cmap_to_log != 0)
        {
            /* write the message in the local character set */
            G_cmap_to_file->write_file(&ds, msg, msglen);
        }
        else
        {
            /* write the message with no character set conversion */
            (void)osfwb(fp, msg, msglen);
        }

        /* done with the formatted text string */
        t3free(msg);
    }
}